

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode ** Extra_bddSpaceExorGates(DdManager *dd,DdNode *bFuncRed,DdNode *zEquations)

{
  int iVar1;
  int *support;
  DdNode **__s;
  DdNode *n;
  DdNode *n_00;
  int local_54;
  DdNode *local_50;
  DdNode *zTemp;
  DdNode *zExor;
  DdNode *pDStack_38;
  int iVarNonCan;
  DdNode *zEquRem;
  int *pVarsNonCan;
  DdNode **pzRes;
  DdNode *zEquations_local;
  DdNode *bFuncRed_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_54 = dd->sizeZ;
  }
  else {
    local_54 = dd->size;
  }
  support = (int *)malloc((long)local_54 << 2);
  Extra_SupportArray(dd,bFuncRed,support);
  __s = (DdNode **)malloc((long)dd->size << 3);
  memset(__s,0,(long)dd->size << 3);
  Cudd_Ref(zEquations);
  pDStack_38 = zEquations;
  while( true ) {
    if (pDStack_38 == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,pDStack_38);
      if (support != (int *)0x0) {
        free(support);
      }
      return __s;
    }
    n = Extra_zddSelectOneSubset(dd,pDStack_38);
    Cudd_Ref(n);
    n_00 = Cudd_zddDiff(dd,pDStack_38,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,pDStack_38);
    zExor._4_4_ = 0xffffffff;
    for (local_50 = n; local_50 != dd->one; local_50 = (local_50->type).kids.T) {
      if (support[local_50->index >> 1] == 1) {
        if (zExor._4_4_ != 0xffffffff) {
          __assert_fail("iVarNonCan == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddAuto.c"
                        ,0x211,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
        }
        zExor._4_4_ = local_50->index >> 1;
      }
    }
    if (zExor._4_4_ == 0xffffffff) break;
    iVar1 = Extra_zddLitCountComb(dd,n);
    pDStack_38 = n_00;
    if (iVar1 < 2) {
      Cudd_RecursiveDerefZdd(dd,n);
    }
    else {
      __s[(int)zExor._4_4_] = n;
    }
  }
  __assert_fail("iVarNonCan != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddAuto.c"
                ,0x215,"DdNode **Extra_bddSpaceExorGates(DdManager *, DdNode *, DdNode *)");
}

Assistant:

DdNode ** Extra_bddSpaceExorGates( DdManager * dd, DdNode * bFuncRed, DdNode * zEquations )
{
	DdNode ** pzRes;
	int * pVarsNonCan;
	DdNode * zEquRem;
	int iVarNonCan;
	DdNode * zExor, * zTemp;

	// get the set of non-canonical variables
	pVarsNonCan = ABC_ALLOC( int, ddMax(dd->size,dd->sizeZ) );
	Extra_SupportArray( dd, bFuncRed, pVarsNonCan );

	// allocate storage for the EXOR sets
	pzRes = ABC_ALLOC( DdNode *, dd->size );
	memset( pzRes, 0, sizeof(DdNode *) * dd->size );

	// go through all the equations
	zEquRem = zEquations;  Cudd_Ref( zEquRem );
	while ( zEquRem != z0 )
	{
		// extract one product
		zExor = Extra_zddSelectOneSubset( dd, zEquRem );   Cudd_Ref( zExor );
		// remove it from the set
		zEquRem = Cudd_zddDiff( dd, zTemp = zEquRem, zExor );  Cudd_Ref( zEquRem );
		Cudd_RecursiveDerefZdd( dd, zTemp );

		// locate the non-canonical variable
		iVarNonCan = -1;
		for ( zTemp = zExor; zTemp != z1; zTemp = cuddT(zTemp) )
		{
			if ( pVarsNonCan[zTemp->index/2] == 1 )
			{
				assert( iVarNonCan == -1 );
				iVarNonCan = zTemp->index/2;
			}
		}
		assert( iVarNonCan != -1 );

		if ( Extra_zddLitCountComb( dd, zExor ) > 1 )
			pzRes[ iVarNonCan ] = zExor; // takes ref
		else
			Cudd_RecursiveDerefZdd( dd, zExor );
	}
	Cudd_RecursiveDerefZdd( dd, zEquRem );

	ABC_FREE( pVarsNonCan );
	return pzRes;
}